

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O2

int Fra_ImpRefineUsingCex(Fra_Man_t *p,Vec_Int_t *vImps)

{
  uint uVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int i;
  int iVar5;
  
  iVar5 = 0;
  for (i = 0; i < vImps->nSize; i = i + 1) {
    uVar1 = Vec_IntEntry(vImps,i);
    if (uVar1 != 0) {
      pAVar3 = Aig_ManObj(p->pManAig,uVar1 & 0xffff);
      pAVar4 = Aig_ManObj(p->pManAig,(int)uVar1 >> 0x10);
      iVar2 = Sml_NodeCheckImp(p->pSml,pAVar3->Id,pAVar4->Id);
      if (iVar2 == 0) {
        Vec_IntWriteEntry(vImps,i,0);
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

int Fra_ImpRefineUsingCex( Fra_Man_t * p, Vec_Int_t * vImps )
{
    Aig_Obj_t * pLeft, * pRight;
    int Imp, i, RetValue = 0;
    Vec_IntForEachEntry( vImps, Imp, i )
    {
        if ( Imp == 0 )
            continue;
        // get the corresponding nodes
        pLeft = Aig_ManObj( p->pManAig, Fra_ImpLeft(Imp) );
        pRight = Aig_ManObj( p->pManAig, Fra_ImpRight(Imp) );
        // check if implication holds using this simulation info
        if ( !Sml_NodeCheckImp(p->pSml, pLeft->Id, pRight->Id) )
        {
            Vec_IntWriteEntry( vImps, i, 0 );
            RetValue = 1;
        }
    }
    return RetValue;
}